

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O2

void record_suite::test_struct(void)

{
  person value;
  oarchive ar;
  ostringstream result;
  allocator<char> local_250 [32];
  person local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  size_type local_200;
  char local_1f8 [8];
  undefined8 uStack_1f0;
  basic_oarchive<char> local_1e8;
  ostringstream local_180 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            (&local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"Kant",local_250);
  local_230.name._M_string_length = local_200;
  local_230.name._M_dataplus._M_p = (pointer)&local_230.name.field_2;
  if (local_208 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8) {
    local_230.name.field_2._8_8_ = uStack_1f0;
  }
  else {
    local_230.name._M_dataplus._M_p = (pointer)local_208;
  }
  local_200 = 0;
  local_1f8[0] = '\0';
  local_230.age = 0x7f;
  local_208 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8;
  std::__cxx11::string::~string((string *)&local_208);
  boost::archive::detail::save_non_pointer_type<trial::protocol::json::basic_oarchive<char>_>::
  save_standard::invoke<record_suite::person>(&local_1e8,&local_230);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[13]>
            ("result.str()","\"[\\\"Kant\\\",127]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x264,"void record_suite::test_struct()",local_250,"[\"Kant\",127]");
  std::__cxx11::string::~string((string *)local_250);
  std::__cxx11::string::~string((string *)&local_230);
  trial::protocol::json::basic_oarchive<char>::~basic_oarchive(&local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_struct()
{
    std::ostringstream result;
    json::oarchive ar(result);
    person value("Kant", 127);
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[\"Kant\",127]");
}